

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O1

bool __thiscall
chatra::ArgumentMatcher::matches
          (ArgumentMatcher *this,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *args,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *subArgs)

{
  unordered_map<chatra::StringId,_unsigned_long,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>_>
  *this_00;
  Class *pCVar1;
  Class *pCVar2;
  pointer pAVar3;
  pointer pAVar4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  int iVar7;
  pointer pAVar8;
  size_type sVar9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  _Hash_node_base *p_Var14;
  ArgumentSpec *arg;
  long lVar15;
  bool bVar16;
  Class *local_40;
  ArgumentMatcher *local_38;
  
  pAVar8 = (args->super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>)
             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8 != 0x10) ||
     (bVar16 = true, pAVar8->key != AnyArgs)) {
    if ((long)(subArgs->
              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(subArgs->
              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
              _M_impl.super__Vector_impl_data._M_start >> 4 ==
        ((long)(this->subArgs).
               super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->subArgs).
               super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
      pAVar8 = (subArgs->
               super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar16 = (subArgs->
               super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
               _M_impl.super__Vector_impl_data._M_finish != pAVar8;
      local_38 = this;
      if (bVar16) {
        lVar12 = 8;
        uVar11 = 0;
        lVar15 = 8;
        do {
          pCVar1 = *(Class **)
                    ((long)&((this->subArgs).
                             super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                             ._M_impl.super__Vector_impl_data._M_start)->type + lVar15);
          if ((((pCVar1 != (Class *)0x0) &&
               (pCVar2 = *(Class **)((long)&pAVar8->key + lVar12), pCVar2 != (Class *)0x0)) &&
              (pCVar2 != pCVar1)) &&
             (local_40 = pCVar1,
             sVar9 = std::
                     _Hashtable<const_chatra::Class_*,_const_chatra::Class_*,_std::allocator<const_chatra::Class_*>,_std::__detail::_Identity,_std::equal_to<const_chatra::Class_*>,_std::hash<const_chatra::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&(pCVar2->parentsSet)._M_h,&local_40), this = local_38, sVar9 == 0)) {
            if (bVar16) goto LAB_001aece5;
            break;
          }
          uVar11 = uVar11 + 1;
          pAVar8 = (subArgs->
                   super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar15 + 0x18;
          lVar12 = lVar12 + 0x10;
          bVar16 = uVar11 < (ulong)((long)(subArgs->
                                          super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8
                                   >> 4);
        } while (bVar16);
      }
      pAVar8 = (args->
               super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pAVar3 = (args->
               super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      bVar16 = pAVar8 == pAVar3;
      if (bVar16) {
        lVar12 = 0;
        sVar13 = 0;
      }
      else {
        this_00 = &this->byName;
        lVar12 = 0;
        uVar11 = 0;
        do {
          sVar13 = uVar11;
          if (uVar11 < this->listCount) {
            pAVar4 = (this->args).
                     super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (((pAVar8->key == Invalid) || (pAVar8->key == pAVar4[uVar11].name)) &&
               (((pCVar1 = pAVar4[uVar11].cl, pCVar1 == (Class *)0x0 ||
                 ((pCVar2 = pAVar8->cl, pCVar2 == (Class *)0x0 || (pCVar2 == pCVar1)))) ||
                (local_40 = pCVar1,
                sVar9 = std::
                        _Hashtable<const_chatra::Class_*,_const_chatra::Class_*,_std::allocator<const_chatra::Class_*>,_std::__detail::_Identity,_std::equal_to<const_chatra::Class_*>,_std::hash<const_chatra::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::count(&(pCVar2->parentsSet)._M_h,&local_40), this = local_38, sVar9 != 0))
               )) {
              sVar13 = uVar11 + 1;
              lVar12 = lVar12 + (ulong)(pAVar4[uVar11].defaultOp == (Node *)0x0);
              iVar7 = 6;
              bVar6 = false;
            }
            else {
              sVar13 = this->listCount;
              iVar7 = 0;
              bVar6 = true;
            }
            if (bVar6) goto LAB_001aebca;
          }
          else {
LAB_001aebca:
            uVar11 = (ulong)pAVar8->key;
            if (uVar11 != 0xffffffff) {
              p_Var10 = std::
                        _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  (&this_00->_M_h,uVar11 % (this->byName)._M_h._M_bucket_count,
                                   &pAVar8->key,uVar11);
              p_Var14 = (_Hash_node_base *)0x0;
              if (p_Var10 != (__node_base_ptr)0x0) {
                p_Var14 = p_Var10->_M_nxt;
              }
              if (p_Var14 == (_Hash_node_base *)0x0) {
                iVar7 = 0;
              }
              else {
                p_Var5 = p_Var14[2]._M_nxt;
                pAVar4 = (local_38->args).
                         super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pCVar1 = pAVar4[(long)p_Var5].cl;
                if ((((pCVar1 == (Class *)0x0) || (pCVar2 = pAVar8->cl, pCVar2 == (Class *)0x0)) ||
                    (pCVar2 == pCVar1)) ||
                   (local_40 = pCVar1,
                   sVar9 = std::
                           _Hashtable<const_chatra::Class_*,_const_chatra::Class_*,_std::allocator<const_chatra::Class_*>,_std::__detail::_Identity,_std::equal_to<const_chatra::Class_*>,_std::hash<const_chatra::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count(&(pCVar2->parentsSet)._M_h,&local_40), sVar9 != 0)) {
                  lVar12 = lVar12 + (ulong)(pAVar4[(long)p_Var5].defaultOp == (Node *)0x0);
                  iVar7 = 6;
                }
                else {
                  iVar7 = 1;
                }
              }
              this = local_38;
              if (p_Var14 != (_Hash_node_base *)0x0) goto LAB_001aec98;
            }
            iVar7 = 6;
            if ((this->hasListVarArg == false) &&
               ((pAVar8->key == Invalid || (this->hasDictVarArg == false)))) {
              iVar7 = 1;
            }
          }
LAB_001aec98:
          if (iVar7 != 6) break;
          pAVar8 = pAVar8 + 1;
          bVar16 = pAVar8 == pAVar3;
          uVar11 = sVar13;
        } while (!bVar16);
      }
      if (bVar16) {
        return lVar12 == this->listCountWithoutDefaults + this->dictCountWithoutDefaults &&
               this->listCountWithoutDefaults <= sVar13;
      }
    }
LAB_001aece5:
    bVar16 = false;
  }
  return bVar16;
}

Assistant:

bool ArgumentMatcher::matches(const std::vector<ArgumentSpec>& args, const std::vector<ArgumentSpec>& subArgs) const {

	if (args.size() == 1 && args[0].key == StringId::AnyArgs)
		return true;

	if (subArgs.size() != this->subArgs.size())
		return false;
	for (size_t i = 0; i < subArgs.size(); i++) {
		auto& arg0 = this->subArgs[i];
		auto& arg1 = subArgs[i];
		if (arg0.cl != nullptr && arg1.cl != nullptr && !arg0.cl->isAssignableFrom(arg1.cl))
			return false;
	}

	size_t index = 0;
	size_t matchedCountWithoutDefaults = 0;

	for (auto& arg : args) {
		if (index < listCount) {
			auto& target = this->args[index++];
			if ((arg.key == StringId::Invalid || arg.key == target.name) &&
					(target.cl == nullptr || arg.cl == nullptr || target.cl->isAssignableFrom(arg.cl))) {
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
			index = listCount;
		}
		if (arg.key != StringId::Invalid) {
			auto it = byName.find(arg.key);
			if (it != byName.end()) {
				auto& target = this->args[it->second];
				if (target.cl != nullptr && arg.cl != nullptr && !target.cl->isAssignableFrom(arg.cl))
					return false;
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
		}
		if (hasListVarArg || (arg.key != StringId::Invalid && hasDictVarArg))
			continue;
		return false;
	}

	return index >= listCountWithoutDefaults &&
			matchedCountWithoutDefaults == listCountWithoutDefaults + dictCountWithoutDefaults;
}